

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::draw_line
          (Image *this,ssize_t x0,ssize_t y0,ssize_t x1,ssize_t y1,uint64_t r,uint64_t g,uint64_t b,
          uint64_t a)

{
  bool bVar1;
  uint64_t uVar2;
  ssize_t sVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  out_of_range *e_1;
  out_of_range *e;
  long local_88;
  ssize_t x;
  ssize_t y;
  ssize_t ystep;
  double derror;
  double error;
  ssize_t dy;
  ssize_t dx;
  ssize_t t_1;
  ssize_t t;
  bool steep;
  uint64_t r_local;
  ssize_t y1_local;
  ssize_t x1_local;
  ssize_t y0_local;
  ssize_t x0_local;
  Image *this_local;
  
  if (((((-1 < x0) && (x0 < this->width)) && (-1 < y0)) && (y0 < this->height)) ||
     (((-1 < x1 && (x1 < this->width)) && ((-1 < y1 && (y1 < this->height)))))) {
    iVar4 = ::std::abs((int)y1 - (int)y0);
    iVar5 = ::std::abs((int)x1 - (int)x0);
    bVar1 = CONCAT44(extraout_var_00,iVar5) < CONCAT44(extraout_var,iVar4);
    r_local = y1;
    y1_local = x1;
    x1_local = y0;
    y0_local = x0;
    if (bVar1) {
      r_local = x1;
      y1_local = y1;
      x1_local = x0;
      y0_local = y0;
    }
    sVar3 = y1_local;
    uVar2 = r_local;
    if (y1_local < y0_local) {
      y1_local = y0_local;
      y0_local = sVar3;
      r_local = x1_local;
      x1_local = uVar2;
    }
    iVar4 = ::std::abs((int)r_local - (int)x1_local);
    derror = 0.0;
    iVar5 = -1;
    if (x1_local < (long)r_local) {
      iVar5 = 1;
    }
    x = x1_local;
    for (local_88 = y0_local; local_88 <= y1_local; local_88 = local_88 + 1) {
      if (bVar1) {
        write_pixel(this,x,local_88,r,g,b,a);
      }
      else {
        write_pixel(this,local_88,x,r,g,b,a);
      }
      derror = (double)CONCAT44(extraout_var_01,iVar4) / (double)(y1_local - y0_local) + derror;
      if (0.5 <= derror) {
        x = iVar5 + x;
        derror = derror - 1.0;
      }
    }
  }
  return;
}

Assistant:

void Image::draw_line(ssize_t x0, ssize_t y0, ssize_t x1, ssize_t y1,
    uint64_t r, uint64_t g, uint64_t b, uint64_t a) {

  // if both endpoints are outside the image, don't bother
  if ((x0 < 0 || x0 >= width || y0 < 0 || y0 >= height) &&
      (x1 < 0 || x1 >= width || y1 < 0 || y1 >= height)) {
    return;
  }

  // line is too steep? then we step along y rather than x
  bool steep = abs(y1 - y0) > abs(x1 - x0);
  if (steep) {
    ssize_t t = x0;
    x0 = y0;
    y0 = t;
    t = x1;
    x1 = y1;
    y1 = t;
  }

  // line is backward? then switch the points
  if (x0 > x1) {
    ssize_t t = x1;
    x1 = x0;
    x0 = t;
    t = y1;
    y1 = y0;
    y0 = t;
  }

  // initialize variables for stepping along the line
  ssize_t dx = x1 - x0;
  ssize_t dy = abs(y1 - y0);
  double error = 0;
  double derror = (double)dy / (double)dx;
  ssize_t ystep = (y0 < y1) ? 1 : -1;
  ssize_t y = y0;

  // now walk along the line
  for (ssize_t x = x0; x <= x1; x++) {
    if (steep) {
      try {
        this->write_pixel(y, x, r, g, b, a);
      } catch (const out_of_range& e) {
        return;
      }
    } else {
      try {
        this->write_pixel(x, y, r, g, b, a);
      } catch (const out_of_range& e) {
        return;
      }
    }
    error += derror;

    // have we passed the center of this row? then move to the next row
    if (error >= 0.5) {
      y += ystep;
      error -= 1.0;
    }
  }
}